

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_horz_only_frame_superres_test.cc
# Opt level: O0

void anon_unknown.dwarf_168b90f::PrepBuffers<unsigned_char>
               (ACMRandom *rnd,int w,int h,int stride,int bd,bool trash_edges,uchar *data)

{
  byte bVar1;
  byte bVar2;
  uint16_t uVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  byte in_R8B;
  byte in_R9B;
  int block_size;
  int block_elts;
  int bpp;
  int c;
  uchar *row_data;
  int r;
  uchar mask;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  bool trash;
  long in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  undefined2 in_stack_ffffffffffffffe4;
  
  bVar1 = in_R9B & 1;
  bVar2 = (char)(1 << (in_R8B & 0x1f)) - 1;
  FillEdge<unsigned_char>
            ((ACMRandom *)
             (CONCAT17(in_R9B,CONCAT16(bVar2,CONCAT24(in_stack_ffffffffffffffe4,
                                                      in_stack_ffffffffffffffe0))) &
             0x1ffffffffffffff),(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
             (int)in_stack_ffffffffffffffd8,SUB41((uint)in_stack_ffffffffffffffd4 >> 0x18,0),
             (uchar *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  for (iVar4 = 0; trash = SUB41((uint)in_stack_ffffffffffffffd4 >> 0x18,0), iVar4 < in_EDX;
      iVar4 = iVar4 + 1) {
    in_stack_ffffffffffffffd8 = (long)_bpp + (long)((iVar4 + 0x20) * in_ECX);
    FillEdge<unsigned_char>
              ((ACMRandom *)
               CONCAT17(bVar1,CONCAT16(bVar2,CONCAT24(in_stack_ffffffffffffffe4,iVar4))),
               (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),(int)in_stack_ffffffffffffffd8,trash,
               (uchar *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    for (in_stack_ffffffffffffffd4 = 0; in_stack_ffffffffffffffd4 < in_ESI;
        in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
      uVar3 = libaom_test::ACMRandom::Rand16
                        ((ACMRandom *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
      ;
      *(byte *)(in_stack_ffffffffffffffd8 + (in_stack_ffffffffffffffd4 + 0x20)) =
           (byte)uVar3 & bVar2;
    }
    FillEdge<unsigned_char>
              ((ACMRandom *)
               CONCAT17(bVar1,CONCAT16(bVar2,CONCAT24(in_stack_ffffffffffffffe4,iVar4))),
               (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),(int)in_stack_ffffffffffffffd8,
               SUB41((uint)in_stack_ffffffffffffffd4 >> 0x18,0),
               (uchar *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  FillEdge<unsigned_char>
            ((ACMRandom *)CONCAT17(bVar1,CONCAT16(bVar2,CONCAT24(in_stack_ffffffffffffffe4,iVar4))),
             (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),(int)in_stack_ffffffffffffffd8,trash,
             (uchar *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  iVar4 = in_ECX * (in_EDX + 0x40);
  memcpy((void *)((long)_bpp + (long)iVar4),_bpp,(long)iVar4);
  return;
}

Assistant:

void PrepBuffers(ACMRandom *rnd, int w, int h, int stride, int bd,
                 bool trash_edges, Pixel *data) {
  assert(rnd);
  const Pixel mask = (1 << bd) - 1;

  // Fill in the first buffer with random data
  // Top border
  FillEdge(rnd, stride * kVPad, bd, trash_edges, data);
  for (int r = 0; r < h; ++r) {
    Pixel *row_data = data + (kVPad + r) * stride;
    // Left border, contents, right border
    FillEdge(rnd, kHPad, bd, trash_edges, row_data);
    for (int c = 0; c < w; ++c) row_data[kHPad + c] = rnd->Rand16() & mask;
    FillEdge(rnd, kHPad, bd, trash_edges, row_data + kHPad + w);
  }
  // Bottom border
  FillEdge(rnd, stride * kVPad, bd, trash_edges, data + stride * (kVPad + h));

  const int bpp = sizeof(*data);
  const int block_elts = stride * (h + 2 * kVPad);
  const int block_size = bpp * block_elts;

  // Now copy that to the second buffer
  memcpy(data + block_elts, data, block_size);
}